

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::localconnect(int n)

{
  uint uVar1;
  clientinfo *pcVar2;
  clientinfo *ci;
  
  pcVar2 = getinfo(n);
  ci = pcVar2;
  privilegemsg(1,"\f7Connected from host IP");
  pcVar2->ownernum = n;
  pcVar2->clientnum = n;
  pcVar2->connectmillis = totalmillis;
  uVar1 = randomMT();
  pcVar2->sessionid = (totalmillis % 10000 + 1) * uVar1 & 0xffffff;
  pcVar2->local = true;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)&connects,&ci);
  sendservinfo(ci);
  return;
}

Assistant:

void localconnect(int n)
    {
        clientinfo *ci = getinfo(n);
        privilegemsg(PRIV_MASTER, "\f7Connected from host IP");
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        ci->local = true;
        connects.add(ci);
        sendservinfo(ci);
    }